

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_imputer<InputData<double,unsigned_long>,long_double>
               (Imputer *imputer,InputData<double,_unsigned_long> *input_data,size_t ntrees,
               int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  size_t sVar1;
  pointer pdVar2;
  double *pdVar3;
  unsigned_long *puVar4;
  int *piVar5;
  pointer puVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  pointer pdVar8;
  long lVar9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var10;
  long lVar11;
  pointer puVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  size_t col;
  ulong uVar17;
  unsigned_long uVar18;
  size_t col_1;
  double dVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_71;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  size_t local_48;
  double local_40;
  size_t local_38;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar1 = input_data->ncols_categ;
  imputer->ncols_categ = sVar1;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar1);
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_70._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_70);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar2 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar8 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar8 != pdVar2; pdVar8 = pdVar8 + 1) {
      *pdVar8 = 0.0;
    }
  }
  local_58 = &imputer->col_modes;
  std::vector<int,_std::allocator<int>_>::resize(local_58,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)&local_70,ntrees,&local_71);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::_M_move_assign(&imputer->imputer_tree,&local_70);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             *)&local_70);
  pdVar3 = input_data->numeric_data;
  if (pdVar3 == (double *)0x0) {
    puVar4 = input_data->Xc_indptr;
    if (puVar4 != (unsigned_long *)0x0) {
      uVar17 = 0;
      while (uVar17 < input_data->ncols_numeric) {
        local_48 = input_data->nrows;
        pdVar3 = input_data->Xc;
        uVar13 = puVar4[uVar17 + 1];
        pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar18 = puVar4[uVar17]; uVar18 < uVar13; uVar18 = uVar18 + 1) {
          dVar19 = pdVar3[uVar18];
          if (0x7fefffffffffffff < (ulong)ABS(dVar19)) {
            dVar19 = 0.0;
          }
          pdVar8[uVar17] = dVar19 + pdVar8[uVar17];
          local_48 = local_48 - (0x7fefffffffffffff < (ulong)ABS(pdVar3[uVar18]));
        }
        pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_50 = (double)((float)pdVar8[uVar17] /
                           ((float)(long)local_48 + (float)(&DAT_003250d8)[(long)local_48 < 0]));
        dVar19 = NAN;
        if (local_48 != 0) {
          dVar19 = local_50;
        }
        pdVar8[uVar17] = dVar19;
        uVar17 = uVar17 + 1;
      }
    }
  }
  else {
    lVar11 = 0;
    for (uVar17 = 0; uVar17 < input_data->ncols_numeric; uVar17 = uVar17 + 1) {
      sVar1 = input_data->nrows;
      pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = sVar1;
      for (sVar15 = 0; sVar1 != sVar15; sVar15 = sVar15 + 1) {
        dVar19 = *(double *)((long)pdVar3 + sVar15 * 8 + sVar1 * lVar11);
        if (0x7fefffffffffffff < (ulong)ABS(dVar19)) {
          dVar19 = 0.0;
        }
        pdVar8[uVar17] = dVar19 + pdVar8[uVar17];
        local_38 = local_38 -
                   (0x7fefffffffffffff <
                   (*(ulong *)((long)pdVar3 + sVar15 * 8 + sVar1 * lVar11) & 0x7fffffffffffffff));
      }
      pdVar8 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = (double)((float)pdVar8[uVar17] /
                         ((float)(long)local_38 + (float)(&DAT_003250d8)[(long)local_38 < 0]));
      dVar19 = NAN;
      if (local_38 != 0) {
        dVar19 = local_40;
      }
      pdVar8[uVar17] = dVar19;
      lVar11 = lVar11 + 8;
    }
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,
               (long)input_data->max_categ,(allocator_type *)&local_71);
    pvVar7 = local_58;
    lVar11 = 0;
    for (uVar17 = 0; puVar6 = local_70._M_impl.super__Vector_impl_data._M_start,
        puVar12 = local_70._M_impl.super__Vector_impl_data._M_start,
        uVar17 < input_data->ncols_categ; uVar17 = uVar17 + 1) {
      for (; puVar12 != local_70._M_impl.super__Vector_impl_data._M_finish; puVar12 = puVar12 + 1) {
        *puVar12 = 0;
      }
      uVar13 = input_data->nrows;
      lVar9 = uVar13 * lVar11;
      piVar5 = input_data->categ_data;
      for (uVar14 = 0; uVar14 < uVar13; uVar14 = uVar14 + 1) {
        lVar16 = (long)*(int *)((long)piVar5 + uVar14 * 4 + lVar9);
        if (-1 < lVar16) {
          local_70._M_impl.super__Vector_impl_data._M_start[lVar16] =
               local_70._M_impl.super__Vector_impl_data._M_start[lVar16] + 1;
          uVar13 = input_data->nrows;
        }
      }
      _Var10 = std::
               __max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (local_70._M_impl.super__Vector_impl_data._M_start,
                          local_70._M_impl.super__Vector_impl_data._M_start +
                          input_data->ncat[uVar17]);
      (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = (int)((ulong)((long)_Var10._M_current - (long)puVar6) >> 3);
      lVar11 = lVar11 + 4;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_70);
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}